

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O2

void __thiscall
chrono::ChArchiveIn::in<chrono::geometry::ChTriangle>
          (ChArchiveIn *this,
          ChNameValue<std::vector<chrono::geometry::ChTriangle,_std::allocator<chrono::geometry::ChTriangle>_>_>
          *bVal)

{
  undefined1 auVar1 [16];
  long lVar2;
  size_t i;
  ulong uVar3;
  undefined1 auVar4 [64];
  size_t arraysize;
  char idname [20];
  size_type local_b8;
  ChNameValue<chrono::geometry::ChTriangle> local_b0;
  char local_98 [24];
  undefined1 local_80 [72];
  double local_38;
  
  std::vector<chrono::geometry::ChTriangle,_std::allocator<chrono::geometry::ChTriangle>_>::clear
            (bVal->_value);
  (**(code **)(*(long *)this + 0x70))(this,bVal->_name,&local_b8);
  std::vector<chrono::geometry::ChTriangle,_std::allocator<chrono::geometry::ChTriangle>_>::resize
            (bVal->_value,local_b8);
  lVar2 = 0;
  for (uVar3 = 0; uVar3 < local_b8; uVar3 = uVar3 + 1) {
    sprintf(local_98,"%lu",uVar3);
    local_80._0_8_ = &PTR__ChGeometry_0118a4d0;
    local_b0._flags = '\0';
    auVar1._8_8_ = 0;
    auVar1._0_8_ = DAT_011dd3e8;
    auVar4 = vbroadcastsd_avx512f(auVar1);
    local_80._8_64_ = vpermt2pd_avx512f(_DAT_00f49bc0,auVar4);
    local_38 = (double)vmovlpd_avx(auVar4._0_16_);
    local_b0._name = local_98;
    local_b0._value = (ChTriangle *)local_80;
    in<chrono::geometry::ChTriangle>(this,&local_b0);
    geometry::ChTriangle::operator=
              ((ChTriangle *)
               ((long)(((bVal->_value->
                        super__Vector_base<chrono::geometry::ChTriangle,_std::allocator<chrono::geometry::ChTriangle>_>
                        )._M_impl.super__Vector_impl_data._M_start)->p1).m_data + lVar2 + -8),
               (ChTriangle *)local_80);
    (**(code **)(*(long *)this + 0x78))(this,bVal->_name);
    lVar2 = lVar2 + 0x50;
  }
  (**(code **)(*(long *)this + 0x80))(this,bVal->_name);
  return;
}

Assistant:

void in     (ChNameValue< std::vector<T> > bVal) {
          bVal.value().clear();
          size_t arraysize;
          this->in_array_pre(bVal.name(), arraysize);
          bVal.value().resize(arraysize);
          for (size_t i = 0; i<arraysize; ++i)
          {
              char idname[20];
              sprintf(idname, "%lu", (unsigned long)i);
              T element;
              ChNameValue< T > array_val(idname, element);
              this->in (array_val);
              bVal.value()[i]=element;
              this->in_array_between(bVal.name());
          }
          this->in_array_end(bVal.name());
      }